

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O1

void __thiscall
Am_Object_Data::propagate_constraint
          (Am_Object_Data *this,Am_Slot_Key key,Am_Constraint *constraint,Am_Slot_Data *proto)

{
  Am_Object_Data *this_00;
  
  for (this_00 = this->first_instance; this_00 != (Am_Object_Data *)0x0;
      this_00 = this_00->next_instance) {
    set_constraint(this_00,key,constraint,proto);
  }
  return;
}

Assistant:

void
Am_Object_Data::propagate_constraint(Am_Slot_Key key, Am_Constraint *constraint,
                                     Am_Slot_Data *proto)
{
#ifdef DEBUG
  Global_Reason_Why_Set |= Am_TRACE_INHERITANCE_PROPAGATION;
#endif
  Am_Object_Data *current = first_instance;
  while (current) {
    current->set_constraint(key, constraint, proto);
    current = current->next_instance;
  }
#ifdef DEBUG
  Global_Reason_Why_Set &= ~Am_TRACE_INHERITANCE_PROPAGATION;
#endif
}